

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theme.h
# Opt level: O2

shared_ptr<gui::DialogBoxStyle> __thiscall
gui::Theme::getStyle<gui::DialogBoxStyle>(Theme *this,String *widgetName)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::DialogBoxStyle> sVar1;
  
  getStyle((Theme *)&stack0xffffffffffffffe0,widgetName);
  std::dynamic_pointer_cast<gui::DialogBoxStyle,gui::Style>((shared_ptr<gui::Style> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  sVar1.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::DialogBoxStyle>)
         sVar1.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> getStyle(const sf::String& widgetName) const {
        return std::dynamic_pointer_cast<T>(getStyle(widgetName));
    }